

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckColorContrast(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  int local_40 [2];
  int rgbFG [3];
  uint errcode;
  AttVal *av;
  Bool gotBG;
  int rgbBG [3];
  Node *node_local;
  TidyDocImpl *doc_local;
  
  stack0xffffffffffffffdc = 0xff000000ff;
  rgbBG[0] = 0xff;
  rgbBG._4_8_ = node;
  BVar1 = Level3_Enabled(doc);
  if (BVar1 != no) {
    av._0_4_ = yes;
    for (unique0x00012000 = *(AttVal **)(rgbBG._4_8_ + 0x28);
        stack0xffffffffffffffd0 != (AttVal *)0x0; unique0x00012000 = stack0xffffffffffffffd0->next)
    {
      if ((((stack0xffffffffffffffd0 != (AttVal *)0x0) &&
           (stack0xffffffffffffffd0->dict != (Attribute *)0x0)) &&
          (stack0xffffffffffffffd0->dict->id == TidyAttr_BGCOLOR)) &&
         (BVar1 = hasValue(stack0xffffffffffffffd0), BVar1 != no)) {
        av._0_4_ = GetRgb(stack0xffffffffffffffd0->value,(int *)((long)&av + 4));
      }
    }
    for (unique0x00012000 = *(AttVal **)(rgbBG._4_8_ + 0x28);
        (Bool)av != no && stack0xffffffffffffffd0 != (AttVal *)0x0;
        unique0x00012000 = stack0xffffffffffffffd0->next) {
      rgbFG[1] = 0;
      if (((stack0xffffffffffffffd0 == (AttVal *)0x0) ||
          (stack0xffffffffffffffd0->dict == (Attribute *)0x0)) ||
         (stack0xffffffffffffffd0->dict->id != TidyAttr_TEXT)) {
        if (((stack0xffffffffffffffd0 == (AttVal *)0x0) ||
            (stack0xffffffffffffffd0->dict == (Attribute *)0x0)) ||
           (stack0xffffffffffffffd0->dict->id != TidyAttr_LINK)) {
          if (((stack0xffffffffffffffd0 == (AttVal *)0x0) ||
              (stack0xffffffffffffffd0->dict == (Attribute *)0x0)) ||
             (stack0xffffffffffffffd0->dict->id != TidyAttr_ALINK)) {
            if (((stack0xffffffffffffffd0 != (AttVal *)0x0) &&
                (stack0xffffffffffffffd0->dict != (Attribute *)0x0)) &&
               (stack0xffffffffffffffd0->dict->id == TidyAttr_VLINK)) {
              rgbFG[1] = 0x2b5;
            }
          }
          else {
            rgbFG[1] = 0x2b4;
          }
        }
        else {
          rgbFG[1] = 0x2b3;
        }
      }
      else {
        rgbFG[1] = 0x2b2;
      }
      if ((rgbFG[1] != 0) && (BVar1 = hasValue(stack0xffffffffffffffd0), BVar1 != no)) {
        memset(local_40,0,0xc);
        BVar1 = GetRgb(stack0xffffffffffffffd0->value,local_40);
        if ((BVar1 != no) && (BVar1 = CompareColors((int *)((long)&av + 4),local_40), BVar1 == no))
        {
          prvTidyReportAccessError(doc,(Node *)rgbBG._4_8_,rgbFG[1]);
        }
      }
    }
  }
  return;
}

Assistant:

static void CheckColorContrast( TidyDocImpl* doc, Node* node )
{
    int rgbBG[3] = {255,255,255};   /* Black text on white BG */

    if (Level3_Enabled( doc ))
    {
        Bool gotBG = yes;
        AttVal* av;

        /* Check for 'BGCOLOR' first to compare with other color attributes */
        for ( av = node->attributes; av; av = av->next )
        {            
            if ( attrIsBGCOLOR(av) )
            {
                if ( hasValue(av) )
                    gotBG = GetRgb( av->value, rgbBG );
            }
        }
        
        /* 
           Search for COLOR attributes to compare with background color
           Must have valid colour contrast
        */
        for ( av = node->attributes; gotBG && av != NULL; av = av->next )
        {
            uint errcode = 0;
            if ( attrIsTEXT(av) )
                errcode = COLOR_CONTRAST_TEXT;
            else if ( attrIsLINK(av) )
                errcode = COLOR_CONTRAST_LINK;
            else if ( attrIsALINK(av) )
                errcode = COLOR_CONTRAST_ACTIVE_LINK;
            else if ( attrIsVLINK(av) )
                errcode = COLOR_CONTRAST_VISITED_LINK;

            if ( errcode && hasValue(av) )
            {
                int rgbFG[3] = {0, 0, 0};  /* Black text */

                if ( GetRgb(av->value, rgbFG) &&
                     !CompareColors(rgbBG, rgbFG) )
                {
                    TY_(ReportAccessError)( doc, node, errcode );
                }
            }
        }
    }
}